

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int MRIStepInnerStepper_SetEvolveFn(MRIStepInnerStepper stepper,MRIStepInnerEvolveFn fn)

{
  char *msgfmt;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    msgfmt = "Inner stepper memory is NULL";
  }
  else {
    if (stepper->ops != (MRIStepInnerStepper_Ops)0x0) {
      stepper->ops->evolve = fn;
      return 0;
    }
    msgfmt = "Inner stepper operations structure is NULL";
  }
  arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepInnerStepper_SetEvolveFn",msgfmt);
  return -0x16;
}

Assistant:

int MRIStepInnerStepper_SetEvolveFn(MRIStepInnerStepper stepper,
                                    MRIStepInnerEvolveFn fn)
{
  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepInnerStepper_SetEvolveFn",
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  if (stepper->ops == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepInnerStepper_SetEvolveFn",
                    "Inner stepper operations structure is NULL");
    return ARK_ILL_INPUT;
  }

  stepper->ops->evolve = fn;

  return ARK_SUCCESS;
}